

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  RealSpace *local_4d8;
  undefined1 *local_4d0;
  RealSpace **local_4c8;
  undefined8 local_4c0;
  CartesianProduct local_4b8 [8];
  CartesianProduct se3;
  undefined1 local_418 [8];
  RobotManifold robot2;
  RobotManifold robot1;
  SO3<mnf::ExpMapQuaternion> so3;
  S2 s2;
  RealSpace local_1b0 [8];
  RealSpace R3;
  RealSpace local_128 [8];
  RealSpace R8;
  CartesianProduct local_b0 [8];
  CartesianProduct merged;
  
  mnf::CartesianProduct::CartesianProduct(local_b0);
  mnf::RealSpace::RealSpace(local_128,8);
  mnf::RealSpace::RealSpace(local_1b0,3);
  mnf::S2::S2((S2 *)(so3.trustMagnitude_.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + 2));
  mnf::SO3<mnf::ExpMapQuaternion>::SO3((SO3<mnf::ExpMapQuaternion> *)&robot1.field_0x98);
  RobotManifold::RobotManifold((RobotManifold *)&robot2.field_0x98);
  mnf::CartesianProduct::multiply((Manifold *)&robot2.field_0x98);
  mnf::Manifold::display();
  RobotManifold::RobotManifold((RobotManifold *)local_418);
  local_4d8 = local_1b0;
  local_4d0 = &robot1.field_0x98;
  local_4c8 = &local_4d8;
  local_4c0 = 2;
  mnf::CartesianProduct::CartesianProduct(local_4b8,local_4c8,2);
  mnf::CartesianProduct::multiply((Manifold *)local_418);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::Manifold::display();
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::CartesianProduct::multiply((Manifold *)local_b0);
  mnf::Manifold::display();
  mnf::CartesianProduct::~CartesianProduct(local_4b8);
  RobotManifold::~RobotManifold((RobotManifold *)local_418);
  RobotManifold::~RobotManifold((RobotManifold *)&robot2.field_0x98);
  mnf::SO3<mnf::ExpMapQuaternion>::~SO3((SO3<mnf::ExpMapQuaternion> *)&robot1.field_0x98);
  mnf::S2::~S2((S2 *)(so3.trustMagnitude_.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 2));
  mnf::RealSpace::~RealSpace(local_1b0);
  mnf::RealSpace::~RealSpace(local_128);
  mnf::CartesianProduct::~CartesianProduct(local_b0);
  return 0;
}

Assistant:

int main()
{
  CartesianProduct merged;
  RealSpace R8(8);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapQuaternion> so3;
  RobotManifold robot1;
  robot1.multiply(R8);
  robot1.display();
  RobotManifold robot2;
  CartesianProduct se3{&R3, &so3};
  robot2.multiply(se3);
  robot2.display();
  merged.multiply(robot1);
  merged.display();
  merged.multiply(robot2);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.multiply(s2);
  merged.multiply(R3);
  merged.display();
  return 0;
}